

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node *
lyd_new_anydata(lyd_node *parent,lys_module *module,char *name,void *value,
               LYD_ANYDATA_VALUETYPE value_type)

{
  LYS_NODE LVar1;
  int iVar2;
  size_t sVar3;
  lyd_node *plVar4;
  LY_ERR *pLVar5;
  lys_node *siblings;
  lys_node **pplVar6;
  lys_node *local_40;
  lys_node *snode;
  
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0) {
LAB_0015b488:
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINVAL;
  }
  else {
    if (parent == (lyd_node *)0x0) {
      pplVar6 = &module->data;
LAB_0015b432:
      siblings = *pplVar6;
      if (siblings == (lys_node *)0x0) goto LAB_0015b488;
    }
    else {
      if ((parent->schema == (lys_node *)0x0) ||
         (siblings = parent->schema->child, siblings == (lys_node *)0x0)) goto LAB_0015b488;
      LVar1 = siblings->nodetype;
      if (LVar1 == LYS_OUTPUT) {
        siblings = siblings->next;
        if (siblings == (lys_node *)0x0) goto LAB_0015b488;
        LVar1 = siblings->nodetype;
      }
      if (LVar1 == LYS_INPUT) {
        pplVar6 = &siblings->child;
        goto LAB_0015b432;
      }
    }
    snode._4_4_ = value_type;
    sVar3 = strlen(name);
    iVar2 = lys_get_data_sibling(module,siblings,name,(int)sVar3,LYS_ANYDATA,&local_40);
    if (local_40 != (lys_node *)0x0 && iVar2 == 0) {
      plVar4 = lyd_create_anydata(parent,local_40,value,snode._4_4_);
      return plVar4;
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_anydata(struct lyd_node *parent, const struct lys_module *module, const char *name,
                void *value, LYD_ANYDATA_VALUETYPE value_type)
{
    const struct lys_node *siblings, *snode;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 0);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_ANYDATA, &snode) || !snode) {
        return NULL;
    }

    return lyd_create_anydata(parent, snode, value, value_type);
}